

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O1

bool __thiscall cmParseMumpsCoverage::ReadCoverageFile(cmParseMumpsCoverage *this,char *file)

{
  cmCTest *this_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  ostream *poVar7;
  string path;
  string line;
  string type;
  string packages;
  ostringstream cmCTestLog_msg;
  ifstream in;
  undefined1 auStack_468 [12];
  uint local_45c;
  long *local_458;
  long local_450;
  long local_448 [2];
  string local_438;
  long *local_418;
  long local_410;
  long local_408 [2];
  char *local_3f8;
  long *local_3f0;
  long local_3e0 [2];
  undefined1 *local_3d0;
  undefined8 local_3c8;
  undefined1 local_3c0;
  undefined7 uStack_3bf;
  long local_3b0 [14];
  ios_base local_340 [264];
  long local_238 [4];
  uint auStack_218 [122];
  
  std::ifstream::ifstream(local_238,file,_S_in);
  uVar4 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((uVar4 & 5) == 0) {
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    local_438._M_string_length = 0;
    local_438.field_2._M_local_buf[0] = '\0';
    local_45c = uVar4;
    local_3f8 = file;
    while (bVar2 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_238,&local_438,(bool *)0x0,-1), bVar2) {
      lVar5 = std::__cxx11::string::find((char)&local_438,0x3a);
      local_3c8 = 0;
      local_3c0 = 0;
      local_3d0 = &local_3c0;
      if (lVar5 != -1) {
        std::__cxx11::string::substr((ulong)&local_418,(ulong)&local_438);
        std::__cxx11::string::substr((ulong)&local_458,(ulong)&local_438);
        iVar3 = std::__cxx11::string::compare((char *)&local_418);
        if (iVar3 == 0) {
          LoadPackages(this,(char *)local_458);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_418);
          if (iVar3 == 0) {
            (*this->_vptr_cmParseMumpsCoverage[2])(this,local_458);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b0,"Parse Error in Mumps coverage file :\n",0x25);
            pcVar1 = local_3f8;
            if (local_3f8 == (char *)0x0) {
              std::ios::clear((int)auStack_468 + (int)*(undefined8 *)(local_3b0[0] + -0x18) + 0xb8);
            }
            else {
              sVar6 = strlen(local_3f8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,pcVar1,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"\ntype: [",8);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_3b0,(char *)local_418,local_410);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\npath:[",8);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_458,local_450);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\ninput line: [",0xf);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_438._M_dataplus._M_p,local_438._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
            this_00 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(this_00,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseMumpsCoverage.cxx"
                         ,0x31,(char *)local_3f0,false);
            if (local_3f0 != local_3e0) {
              operator_delete(local_3f0,local_3e0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
            std::ios_base::~ios_base(local_340);
          }
        }
        if (local_458 != local_448) {
          operator_delete(local_458,local_448[0] + 1);
        }
        if (local_418 != local_408) {
          operator_delete(local_418,local_408[0] + 1);
        }
      }
      if (local_3d0 != &local_3c0) {
        operator_delete(local_3d0,CONCAT71(uStack_3bf,local_3c0) + 1);
      }
    }
    uVar4 = local_45c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,
                      CONCAT71(local_438.field_2._M_allocated_capacity._1_7_,
                               local_438.field_2._M_local_buf[0]) + 1);
      uVar4 = local_45c;
    }
  }
  std::ifstream::~ifstream(local_238);
  return (uVar4 & 5) == 0;
}

Assistant:

bool cmParseMumpsCoverage::ReadCoverageFile(const char* file)
{
  // Read the gtm_coverage.mcov file, that has two lines of data:
  // packages:/full/path/to/Vista/Packages
  // coverage_dir:/full/path/to/dir/with/*.mcov
  cmsys::ifstream in(file);
  if (!in) {
    return false;
  }
  std::string line;
  while (cmSystemTools::GetLineFromStream(in, line)) {
    std::string::size_type pos = line.find(':', 0);
    std::string packages;
    if (pos != std::string::npos) {
      std::string type = line.substr(0, pos);
      std::string path = line.substr(pos + 1);
      if (type == "packages") {
        this->LoadPackages(path.c_str());
      } else if (type == "coverage_dir") {
        this->LoadCoverageData(path.c_str());
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Parse Error in Mumps coverage file :\n"
                     << file << "\ntype: [" << type << "]\npath:[" << path
                     << "]\n"
                        "input line: ["
                     << line << "]\n");
      }
    }
  }
  return true;
}